

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<Qt::GestureType,_int>_>::Data
          (Data<QHashPrivate::Node<Qt::GestureType,_int>_> *this,
          Data<QHashPrivate::Node<Qt::GestureType,_int>_> *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  Node<Qt::GestureType,_int> *pNVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  R RVar8;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar5 = other->numBuckets;
  sVar6 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar6;
  this->spans = (Span *)0x0;
  RVar8 = allocateSpans(sVar5);
  this->spans = (Span *)RVar8.spans;
  lVar4 = 0;
  for (sVar5 = 0; sVar5 != RVar8.nSpans; sVar5 = sVar5 + 1) {
    pSVar1 = other->spans;
    for (sVar6 = 0; sVar6 != 0x80; sVar6 = sVar6 + 1) {
      uVar7 = (ulong)pSVar1->offsets[sVar6 + lVar4];
      if (uVar7 != 0xff) {
        pEVar2 = pSVar1[sVar5].entries;
        local_48.span = this->spans + sVar5;
        local_48.index = sVar6;
        pNVar3 = Bucket::insert(&local_48);
        *pNVar3 = *(Node<Qt::GestureType,_int> *)(pEVar2 + uVar7);
      }
    }
    lVar4 = lVar4 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }